

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void set_get_meta_test(void)

{
  fdb_status fVar1;
  size_t keylen;
  char *__format;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char keybuf [256];
  fdb_doc *local_250;
  fdb_kvs_handle *local_248;
  fdb_file_handle *local_240;
  timeval local_238;
  fdb_kvs_config local_228;
  fdb_config local_210;
  char local_118 [256];
  
  gettimeofday(&local_238,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_210.wal_threshold = 0x400;
  local_210.seqtree_opt = '\x01';
  local_210.purging_interval = 1;
  local_210.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&local_240,"./dummy1",&local_210);
  fdb_kvs_open(local_240,&local_248,"db1",&local_228);
  sprintf(local_118,"key%d",0);
  keylen = strlen(local_118);
  fdb_doc_create(&local_250,local_118,keylen,(void *)0x0,0,(void *)0x0,0);
  fdb_set(local_248,local_250);
  fVar1 = fdb_get(local_248,local_250);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_byoffset(local_248,local_250);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_get_metaonly(local_248,local_250);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_get_metaonly_byseq(local_248,local_250);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_del(local_248,local_250);
        fVar1 = fdb_get(local_248,local_250);
        if (fVar1 == FDB_RESULT_KEY_NOT_FOUND) {
          if (local_250->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar1 = fdb_get_metaonly(local_248,local_250);
          if (fVar1 == FDB_RESULT_SUCCESS) {
            if (local_250->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar1 = fdb_get_metaonly_byseq(local_248,local_250);
            if (fVar1 == FDB_RESULT_SUCCESS) {
              if (local_250->deleted != false) {
                fVar1 = fdb_get_byoffset(local_248,local_250);
                if (fVar1 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (local_250->deleted != false) {
                    fdb_doc_free(local_250);
                    fdb_kvs_close(local_248);
                    fdb_close(local_240);
                    fdb_shutdown();
                    memleak_end();
                    __format = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      __format = "%s FAILED\n";
                    }
                    fprintf(_stderr,__format,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void set_get_meta_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    char keybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.purging_interval = 1;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db1", &kvs_config);

    sprintf(keybuf, "key%d", 0);
    fdb_doc_create(&rdoc, keybuf, strlen(keybuf), NULL, 0, NULL, 0);
    fdb_set(db, rdoc);
    status = fdb_get(db, rdoc);
    assert(status == FDB_RESULT_SUCCESS);
    status = fdb_get_byoffset(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_get_metaonly(db, rdoc);
    assert(status == FDB_RESULT_SUCCESS);
    status = fdb_get_metaonly_byseq(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_del(db, rdoc);
    status = fdb_get(db, rdoc);
    assert(status == FDB_RESULT_KEY_NOT_FOUND);
    assert(rdoc->deleted == true);

    status = fdb_get_metaonly(db, rdoc);
    assert(status == FDB_RESULT_SUCCESS);
    assert(rdoc->deleted == true);

    status = fdb_get_metaonly_byseq(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    assert(rdoc->deleted == true);

    status = fdb_get_byoffset(db, rdoc);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
    assert(rdoc->deleted == true);


    fdb_doc_free(rdoc);
    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("set get meta test");
}